

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O0

byte * __thiscall nuraft::buffer::get_raw(buffer *this,size_t len)

{
  size_t sVar1;
  size_t sVar2;
  overflow_error *this_00;
  byte *pbVar3;
  ulong in_RSI;
  buffer *in_RDI;
  byte *d;
  
  sVar1 = size(in_RDI);
  sVar2 = pos(in_RDI);
  if (sVar1 - sVar2 < in_RSI) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error
              (this_00,"insufficient buffer available for a raw byte array");
    __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  pbVar3 = data(in_RDI);
  if ((*(uint *)in_RDI & 0x80000000) == 0) {
    *(short *)(in_RDI + 2) = *(short *)(in_RDI + 2) + (short)in_RSI;
  }
  else {
    *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) + (int)in_RSI;
  }
  return pbVar3;
}

Assistant:

byte* buffer::get_raw(size_t len) {
    if ( size() - pos() < len) {
        throw std::overflow_error
              ( "insufficient buffer available for a raw byte array" );
    }

    byte* d = data();
    __mv_fw_block(this, len);
    return d;
}